

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

void updateOutInIndex(HighsIndexCollection *index_collection,HighsInt *out_from_ix,
                     HighsInt *out_to_ix,HighsInt *in_from_ix,HighsInt *in_to_ix,
                     HighsInt *current_set_entry)

{
  HighsInt HVar1;
  pointer piVar2;
  int iVar3;
  HighsIndexCollection *pHVar4;
  long lVar5;
  int iVar6;
  
  if (index_collection->is_interval_ == true) {
    *out_from_ix = index_collection->from_;
    *out_to_ix = index_collection->to_;
    *in_from_ix = index_collection->to_ + 1;
    iVar3 = index_collection->dimension_;
  }
  else {
    if (index_collection->is_set_ != true) {
      *out_from_ix = *in_to_ix + 1;
      *out_to_ix = index_collection->dimension_ + -1;
      lVar5 = (long)*in_to_ix;
      iVar3 = *in_to_ix + -1;
      do {
        lVar5 = lVar5 + 1;
        if (index_collection->dimension_ <= lVar5) goto LAB_00384d6a;
        iVar3 = iVar3 + 1;
      } while ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5] != 0);
      *out_to_ix = iVar3;
LAB_00384d6a:
      *in_from_ix = *out_to_ix + 1;
      *in_to_ix = index_collection->dimension_ + -1;
      lVar5 = (long)*out_to_ix;
      iVar3 = *out_to_ix + -1;
      do {
        lVar5 = lVar5 + 1;
        if (index_collection->dimension_ <= lVar5) {
          return;
        }
        iVar3 = iVar3 + 1;
      } while ((index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5] == 0);
      goto LAB_00384d32;
    }
    piVar2 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar1 = piVar2[*current_set_entry];
    *out_from_ix = HVar1;
    *out_to_ix = HVar1;
    iVar3 = *current_set_entry;
    iVar6 = iVar3 + 1;
    *current_set_entry = iVar6;
    if (iVar6 < index_collection->set_num_entries_) {
      lVar5 = (long)iVar3 + 1;
      do {
        if (*out_to_ix + 1 < piVar2[lVar5]) break;
        *out_to_ix = piVar2[*current_set_entry];
        *current_set_entry = *current_set_entry + 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < index_collection->set_num_entries_);
    }
    *in_from_ix = *out_to_ix + 1;
    pHVar4 = (HighsIndexCollection *)(piVar2 + *current_set_entry);
    if (index_collection->set_num_entries_ <= *current_set_entry) {
      pHVar4 = index_collection;
    }
    iVar3 = pHVar4->dimension_;
  }
  iVar3 = iVar3 + -1;
LAB_00384d32:
  *in_to_ix = iVar3;
  return;
}

Assistant:

void updateOutInIndex(const HighsIndexCollection& index_collection,
                      HighsInt& out_from_ix, HighsInt& out_to_ix,
                      HighsInt& in_from_ix, HighsInt& in_to_ix,
                      HighsInt& current_set_entry) {
  if (index_collection.is_interval_) {
    out_from_ix = index_collection.from_;
    out_to_ix = index_collection.to_;
    in_from_ix = index_collection.to_ + 1;
    in_to_ix = index_collection.dimension_ - 1;
  } else if (index_collection.is_set_) {
    out_from_ix = index_collection.set_[current_set_entry];
    out_to_ix = out_from_ix;
    current_set_entry++;
    HighsInt current_set_entry0 = current_set_entry;
    for (HighsInt set_entry = current_set_entry0;
         set_entry < index_collection.set_num_entries_; set_entry++) {
      HighsInt ix = index_collection.set_[set_entry];
      if (ix > out_to_ix + 1) break;
      out_to_ix = index_collection.set_[current_set_entry];
      current_set_entry++;
    }
    in_from_ix = out_to_ix + 1;
    if (current_set_entry < index_collection.set_num_entries_) {
      in_to_ix = index_collection.set_[current_set_entry] - 1;
    } else {
      // Account for getting to the end of the set
      in_to_ix = index_collection.dimension_ - 1;
    }
  } else {
    out_from_ix = in_to_ix + 1;
    out_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = in_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (!index_collection.mask_[ix]) {
        out_to_ix = ix - 1;
        break;
      }
    }
    in_from_ix = out_to_ix + 1;
    in_to_ix = index_collection.dimension_ - 1;
    for (HighsInt ix = out_to_ix + 1; ix < index_collection.dimension_; ix++) {
      if (index_collection.mask_[ix]) {
        in_to_ix = ix - 1;
        break;
      }
    }
  }
}